

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltl_parser.c
# Opt level: O1

int checkAllBoolHaveAIGPointer(ltlNode *topASTNode)

{
  ltlNode_t **pplVar1;
  tokenType tVar2;
  int iVar3;
  bool bVar4;
  
  while( true ) {
    while( true ) {
      tVar2 = topASTNode->type;
      if (BOOL < tVar2) {
        puts("\nUNSUPPORTED LTL NODE TYPE:: Aborting execution");
        exit(0);
      }
      if ((0x74U >> (tVar2 & 0x1f) & 1) == 0) break;
      if (topASTNode->left == (ltlNode_t *)0x0) {
        __assert_fail("topASTNode->left != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/ltl_parser.c"
                      ,0x333,"int checkAllBoolHaveAIGPointer(ltlNode *)");
      }
      pplVar1 = &topASTNode->right;
      topASTNode = topASTNode->left;
      if (*pplVar1 != (ltlNode_t *)0x0) {
        __assert_fail("topASTNode->right == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/ltl_parser.c"
                      ,0x334,"int checkAllBoolHaveAIGPointer(ltlNode *)");
      }
    }
    if ((0x8bU >> (tVar2 & 0x1f) & 1) == 0) {
      bVar4 = topASTNode->pObj == (Aig_Obj_t *)0x0;
      if (bVar4) {
        printf("\nfaulting PODMANDYO topASTNode->name = %s\n",topASTNode->name);
      }
      return (uint)!bVar4;
    }
    if (topASTNode->left == (ltlNode *)0x0) {
      __assert_fail("topASTNode->left != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/ltl_parser.c"
                    ,0x32b,"int checkAllBoolHaveAIGPointer(ltlNode *)");
    }
    if (topASTNode->right == (ltlNode_t *)0x0) {
      __assert_fail("topASTNode->right != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/ltl_parser.c"
                    ,0x32c,"int checkAllBoolHaveAIGPointer(ltlNode *)");
    }
    iVar3 = checkAllBoolHaveAIGPointer(topASTNode->left);
    if (iVar3 == 0) break;
    topASTNode = topASTNode->right;
  }
  return 0;
}

Assistant:

int checkAllBoolHaveAIGPointer( ltlNode *topASTNode )
{
	
	switch( topASTNode->type ){
		case BOOL:
			if( topASTNode->pObj != NULL )
				return 1;
			else
			{
				printf("\nfaulting PODMANDYO topASTNode->name = %s\n", topASTNode->name);
				return 0;
			}
		case AND:
		case OR:
		case IMPLY:
		case UNTIL:
			assert( topASTNode->left != NULL );
			assert( topASTNode->right != NULL );
			return checkAllBoolHaveAIGPointer( topASTNode->left ) && checkAllBoolHaveAIGPointer( topASTNode->right );
			
		case NOT:
		case NEXT:
		case GLOBALLY:
		case EVENTUALLY:
			assert( topASTNode->left != NULL );
			assert( topASTNode->right == NULL );
			return checkAllBoolHaveAIGPointer( topASTNode->left );
		default:
			printf("\nUNSUPPORTED LTL NODE TYPE:: Aborting execution\n");
			exit(0);
	}
}